

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O0

int ARKStepSetOptimalParams(void *arkode_mem)

{
  int iVar1;
  ARKodeHAdaptMem pAVar2;
  int retval;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMem *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  void *in_stack_ffffffffffffffc8;
  long local_20;
  ARKodeMem local_18;
  int local_4;
  
  local_4 = arkStep_AccessStepMem
                      (in_stack_ffffffffffffffc8,
                       (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffb8,(ARKodeARKStepMem *)0xe861b4);
  if (local_4 == 0) {
    if (local_18->hadapt_mem == (ARKodeHAdaptMem)0x0) {
      arkProcessError(local_18,-0x15,"ARKode::ARKStep","ARKStepSetOptimalParams",
                      "Adaptivity memory structure not allocated.");
      local_4 = -0x15;
    }
    else {
      pAVar2 = local_18->hadapt_mem;
      if ((*(int *)(local_20 + 0x18) == 0) || (*(int *)(local_20 + 0x1c) != 0)) {
        if ((*(int *)(local_20 + 0x1c) == 0) || (*(int *)(local_20 + 0x18) != 0)) {
          iVar1 = *(int *)(local_20 + 0x50);
          if (iVar1 == 3) {
            pAVar2->imethod = 0;
            pAVar2->safety = 0.965;
            pAVar2->bias = 1.42;
            pAVar2->growth = 28.7;
            pAVar2->k1 = 0.54;
            pAVar2->k2 = 0.36;
            pAVar2->k3 = 0.14;
            pAVar2->etamxf = 0.46;
            pAVar2->small_nef = 2;
            pAVar2->etacf = 0.25;
            *(undefined8 *)(local_20 + 0xe0) = 0x3fcc28f5c28f5c29;
            *(undefined8 *)(local_20 + 0xb8) = 0x3fc5c28f5c28f5c3;
            *(undefined8 *)(local_20 + 0xc0) = 0x4002666666666666;
            *(undefined8 *)(local_20 + 0xa8) = 0x3fc851eb851eb852;
            *(undefined4 *)(local_20 + 0xe8) = 0x3c;
          }
          else if (iVar1 == 4) {
            pAVar2->imethod = 0;
            pAVar2->safety = 0.97;
            pAVar2->bias = 1.35;
            pAVar2->growth = 25.0;
            pAVar2->k1 = 0.543;
            pAVar2->k2 = 0.297;
            pAVar2->k3 = 0.14;
            pAVar2->etamxf = 0.47;
            pAVar2->small_nef = 2;
            pAVar2->etacf = 0.25;
            *(undefined8 *)(local_20 + 0xe0) = 0x3fceb851eb851eb8;
            *(undefined8 *)(local_20 + 0xb8) = 0x3fd0a3d70a3d70a4;
            *(undefined8 *)(local_20 + 0xc0) = 0x4002666666666666;
            *(undefined8 *)(local_20 + 0xa8) = 0x3fc47ae147ae147b;
            *(undefined4 *)(local_20 + 0xe8) = 0x1f;
          }
          else if (iVar1 == 5) {
            pAVar2->imethod = 1;
            pAVar2->safety = 0.993;
            pAVar2->bias = 1.15;
            pAVar2->growth = 28.5;
            pAVar2->k1 = 0.8;
            pAVar2->k2 = 0.35;
            pAVar2->etamxf = 0.3;
            pAVar2->small_nef = 2;
            pAVar2->etacf = 0.25;
            *(undefined8 *)(local_20 + 0xe0) = 0x3fd0000000000000;
            *(undefined8 *)(local_20 + 0xb8) = 0x3fd999999999999a;
            *(undefined8 *)(local_20 + 0xc0) = 0x4002666666666666;
            *(undefined8 *)(local_20 + 0xa8) = 0x3fd47ae147ae147b;
            *(undefined4 *)(local_20 + 0xe8) = 0x1f;
          }
        }
        else {
          switch(*(undefined4 *)(local_20 + 0x50)) {
          case 2:
            pAVar2->imethod = 0;
            pAVar2->safety = 0.96;
            pAVar2->bias = 1.5;
            pAVar2->growth = 20.0;
            pAVar2->etamxf = 0.3;
            pAVar2->small_nef = 2;
            pAVar2->etacf = 0.25;
            *(undefined8 *)(local_20 + 0xe0) = 0x3f50624dd2f1a9fc;
            *(undefined4 *)(local_20 + 0xf8) = 5;
            *(undefined8 *)(local_20 + 0xb8) = 0x3fd3333333333333;
            *(undefined8 *)(local_20 + 0xc0) = 0x4002666666666666;
            *(undefined8 *)(local_20 + 0xa8) = 0x3fc999999999999a;
            *(undefined4 *)(local_20 + 0xe8) = 0x14;
            break;
          case 3:
            pAVar2->imethod = 2;
            pAVar2->safety = 0.957;
            pAVar2->bias = 1.9;
            pAVar2->growth = 17.6;
            pAVar2->etamxf = 0.45;
            pAVar2->small_nef = 2;
            pAVar2->etacf = 0.25;
            *(undefined8 *)(local_20 + 0xe0) = 0x3fcc28f5c28f5c29;
            *(undefined8 *)(local_20 + 0xb8) = 0x3fc5c28f5c28f5c3;
            *(undefined8 *)(local_20 + 0xc0) = 0x4002666666666666;
            *(undefined8 *)(local_20 + 0xa8) = 0x3fc851eb851eb852;
            *(undefined4 *)(local_20 + 0xe8) = 0x3c;
            break;
          case 4:
            pAVar2->imethod = 0;
            pAVar2->safety = 0.988;
            pAVar2->bias = 1.2;
            pAVar2->growth = 31.5;
            pAVar2->k1 = 0.535;
            pAVar2->k2 = 0.209;
            pAVar2->k3 = 0.148;
            pAVar2->etamxf = 0.33;
            pAVar2->small_nef = 2;
            pAVar2->etacf = 0.25;
            *(undefined8 *)(local_20 + 0xe0) = 0x3fceb851eb851eb8;
            *(undefined8 *)(local_20 + 0xb8) = 0x3fd0a3d70a3d70a4;
            *(undefined8 *)(local_20 + 0xc0) = 0x4002666666666666;
            *(undefined8 *)(local_20 + 0xa8) = 0x3fc47ae147ae147b;
            *(undefined4 *)(local_20 + 0xe8) = 0x1f;
            break;
          case 5:
            pAVar2->imethod = 0;
            pAVar2->safety = 0.937;
            pAVar2->bias = 3.3;
            pAVar2->growth = 22.0;
            pAVar2->k1 = 0.56;
            pAVar2->k2 = 0.338;
            pAVar2->k3 = 0.14;
            pAVar2->etamxf = 0.44;
            pAVar2->small_nef = 2;
            pAVar2->etacf = 0.25;
            *(undefined8 *)(local_20 + 0xe0) = 0x3fd0000000000000;
            *(undefined8 *)(local_20 + 0xb8) = 0x3fd999999999999a;
            *(undefined8 *)(local_20 + 0xc0) = 0x4002666666666666;
            *(undefined8 *)(local_20 + 0xa8) = 0x3fd47ae147ae147b;
            *(undefined4 *)(local_20 + 0xe8) = 0x1f;
          }
        }
      }
      else {
        pAVar2->imethod = 1;
        pAVar2->safety = 0.99;
        pAVar2->bias = 1.2;
        pAVar2->growth = 25.0;
        pAVar2->k1 = 0.8;
        pAVar2->k2 = 0.31;
        pAVar2->etamxf = 0.3;
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ARKStepSetOptimalParams(void *arkode_mem)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  ARKodeHAdaptMem hadapt_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepSetOptimalParams",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* access ARKodeHAdaptMem structure */
  if (ark_mem->hadapt_mem == NULL) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                    "ARKStepSetOptimalParams",
                    MSG_ARKADAPT_NO_MEM);
    return(ARK_MEM_NULL);
  }
  hadapt_mem = ark_mem->hadapt_mem;

  /* Choose values based on method, order */

  /*    explicit */
  if (step_mem->explicit && !step_mem->implicit) {
    hadapt_mem->imethod = ARK_ADAPT_PI;
    hadapt_mem->safety  = RCONST(0.99);
    hadapt_mem->bias    = RCONST(1.2);
    hadapt_mem->growth  = RCONST(25.0);
    hadapt_mem->k1      = RCONST(0.8);
    hadapt_mem->k2      = RCONST(0.31);
    hadapt_mem->etamxf  = RCONST(0.3);

  /*    implicit */
  } else if (step_mem->implicit && !step_mem->explicit) {
    switch (step_mem->q) {
    case 2:   /* just use standard defaults since better ones unknown */
      hadapt_mem->imethod   = ARK_ADAPT_PID;
      hadapt_mem->safety    = SAFETY;
      hadapt_mem->bias      = BIAS;
      hadapt_mem->growth    = GROWTH;
      hadapt_mem->etamxf    = ETAMXF;
      hadapt_mem->small_nef = SMALL_NEF;
      hadapt_mem->etacf     = ETACF;
      step_mem->nlscoef     = RCONST(0.001);
      step_mem->maxcor      = 5;
      step_mem->crdown      = CRDOWN;
      step_mem->rdiv        = RDIV;
      step_mem->dgmax       = DGMAX;
      step_mem->msbp        = MSBP;
      break;
    case 3:
      hadapt_mem->imethod   = ARK_ADAPT_I;
      hadapt_mem->safety    = RCONST(0.957);
      hadapt_mem->bias      = RCONST(1.9);
      hadapt_mem->growth    = RCONST(17.6);
      hadapt_mem->etamxf    = RCONST(0.45);
      hadapt_mem->small_nef = SMALL_NEF;
      hadapt_mem->etacf     = ETACF;
      step_mem->nlscoef     = RCONST(0.22);
      step_mem->crdown      = RCONST(0.17);
      step_mem->rdiv        = RCONST(2.3);
      step_mem->dgmax       = RCONST(0.19);
      step_mem->msbp        = 60;
      break;
    case 4:
      hadapt_mem->imethod   = ARK_ADAPT_PID;
      hadapt_mem->safety    = RCONST(0.988);
      hadapt_mem->bias      = RCONST(1.2);
      hadapt_mem->growth    = RCONST(31.5);
      hadapt_mem->k1        = RCONST(0.535);
      hadapt_mem->k2        = RCONST(0.209);
      hadapt_mem->k3        = RCONST(0.148);
      hadapt_mem->etamxf    = RCONST(0.33);
      hadapt_mem->small_nef = SMALL_NEF;
      hadapt_mem->etacf     = ETACF;
      step_mem->nlscoef     = RCONST(0.24);
      step_mem->crdown      = RCONST(0.26);
      step_mem->rdiv        = RCONST(2.3);
      step_mem->dgmax       = RCONST(0.16);
      step_mem->msbp        = 31;
      break;
    case 5:
      hadapt_mem->imethod   = ARK_ADAPT_PID;
      hadapt_mem->safety    = RCONST(0.937);
      hadapt_mem->bias      = RCONST(3.3);
      hadapt_mem->growth    = RCONST(22.0);
      hadapt_mem->k1        = RCONST(0.56);
      hadapt_mem->k2        = RCONST(0.338);
      hadapt_mem->k3        = RCONST(0.14);
      hadapt_mem->etamxf    = RCONST(0.44);
      hadapt_mem->small_nef = SMALL_NEF;
      hadapt_mem->etacf     = ETACF;
      step_mem->nlscoef     = RCONST(0.25);
      step_mem->crdown      = RCONST(0.4);
      step_mem->rdiv        = RCONST(2.3);
      step_mem->dgmax       = RCONST(0.32);
      step_mem->msbp        = 31;
      break;
    }

  /*    imex */
  } else {
    switch (step_mem->q) {
    case 3:
      hadapt_mem->imethod   = ARK_ADAPT_PID;
      hadapt_mem->safety    = RCONST(0.965);
      hadapt_mem->bias      = RCONST(1.42);
      hadapt_mem->growth    = RCONST(28.7);
      hadapt_mem->k1        = RCONST(0.54);
      hadapt_mem->k2        = RCONST(0.36);
      hadapt_mem->k3        = RCONST(0.14);
      hadapt_mem->etamxf    = RCONST(0.46);
      hadapt_mem->small_nef = SMALL_NEF;
      hadapt_mem->etacf     = ETACF;
      step_mem->nlscoef     = RCONST(0.22);
      step_mem->crdown      = RCONST(0.17);
      step_mem->rdiv        = RCONST(2.3);
      step_mem->dgmax       = RCONST(0.19);
      step_mem->msbp        = 60;
      break;
    case 4:
      hadapt_mem->imethod   = ARK_ADAPT_PID;
      hadapt_mem->safety    = RCONST(0.97);
      hadapt_mem->bias      = RCONST(1.35);
      hadapt_mem->growth    = RCONST(25.0);
      hadapt_mem->k1        = RCONST(0.543);
      hadapt_mem->k2        = RCONST(0.297);
      hadapt_mem->k3        = RCONST(0.14);
      hadapt_mem->etamxf    = RCONST(0.47);
      hadapt_mem->small_nef = SMALL_NEF;
      hadapt_mem->etacf     = ETACF;
      step_mem->nlscoef     = RCONST(0.24);
      step_mem->crdown      = RCONST(0.26);
      step_mem->rdiv        = RCONST(2.3);
      step_mem->dgmax       = RCONST(0.16);
      step_mem->msbp        = 31;
      break;
    case 5:
      hadapt_mem->imethod   = ARK_ADAPT_PI;
      hadapt_mem->safety    = RCONST(0.993);
      hadapt_mem->bias      = RCONST(1.15);
      hadapt_mem->growth    = RCONST(28.5);
      hadapt_mem->k1        = RCONST(0.8);
      hadapt_mem->k2        = RCONST(0.35);
      hadapt_mem->etamxf    = RCONST(0.3);
      hadapt_mem->small_nef = SMALL_NEF;
      hadapt_mem->etacf     = ETACF;
      step_mem->nlscoef     = RCONST(0.25);
      step_mem->crdown      = RCONST(0.4);
      step_mem->rdiv        = RCONST(2.3);
      step_mem->dgmax       = RCONST(0.32);
      step_mem->msbp        = 31;
      break;
    }

  }
  return(ARK_SUCCESS);
}